

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen_key.c
# Opt level: O1

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  int ret;
  mbedtls_pk_type_t mVar4;
  mbedtls_ecp_curve_info *pmVar5;
  char *pcVar6;
  mbedtls_pk_info_t *info;
  char **ppcVar7;
  char *__s1;
  char *pcVar8;
  ulong uVar9;
  mbedtls_pk_context key;
  mbedtls_mpi QP;
  mbedtls_mpi DQ;
  mbedtls_mpi DP;
  mbedtls_mpi E;
  mbedtls_mpi D;
  mbedtls_mpi Q;
  mbedtls_mpi P;
  mbedtls_mpi N;
  mbedtls_ctr_drbg_context ctr_drbg;
  mbedtls_entropy_context entropy;
  char buf [1024];
  mbedtls_pk_context mStack_a68;
  mbedtls_mpi local_a58;
  mbedtls_mpi local_a40;
  mbedtls_mpi local_a28;
  mbedtls_mpi local_a10;
  mbedtls_mpi local_9f8;
  mbedtls_mpi local_9e0;
  mbedtls_mpi local_9c8;
  mbedtls_mpi local_9b0;
  mbedtls_ctr_drbg_context local_998;
  mbedtls_entropy_context local_840;
  char local_438 [1032];
  
  mbedtls_mpi_init(&local_9b0);
  mbedtls_mpi_init(&local_9c8);
  mbedtls_mpi_init(&local_9e0);
  mbedtls_mpi_init(&local_9f8);
  mbedtls_mpi_init(&local_a10);
  mbedtls_mpi_init(&local_a28);
  mbedtls_mpi_init(&local_a40);
  mbedtls_mpi_init(&local_a58);
  mbedtls_pk_init(&mStack_a68);
  mbedtls_ctr_drbg_init(&local_998);
  memset(local_438,0,0x400);
  if (argc == 0) {
LAB_001096e2:
    printf(
          "\n usage: gen_key param=<>...\n\n acceptable parameters:\n    type=rsa|ec           default: rsa\n    rsa_keysize=%%d        default: 4096\n    ec_curve=%%s           see below\n    filename=%%s           default: keyfile.key\n    format=pem|der        default: pem\n    use_dev_random=0|1    default: 0\n\n"
          );
    puts(" available ec_curve values:");
    pmVar5 = mbedtls_ecp_curve_list();
    printf("    %s (default)\n",pmVar5->name);
    iVar2 = 1;
    if (pmVar5[1].name != (char *)0x0) {
      ppcVar7 = &pmVar5[2].name;
      do {
        printf("    %s\n");
        pcVar8 = *ppcVar7;
        ppcVar7 = ppcVar7 + 2;
      } while (pcVar8 != (char *)0x0);
    }
    bVar1 = false;
    ret = 1;
    goto LAB_001097f7;
  }
  opt.type = 1;
  opt.rsa_keysize = 0x1000;
  pmVar5 = mbedtls_ecp_curve_list();
  opt.ec_curve = pmVar5->grp_id;
  opt.filename = "keyfile.key";
  opt.format = 0;
  opt.use_dev_random = 0;
  if (1 < argc) {
    uVar9 = 1;
    do {
      pcVar8 = argv[uVar9];
      pcVar6 = strchr(pcVar8,0x3d);
      if (pcVar6 == (char *)0x0) goto LAB_001096e2;
      __s1 = pcVar6 + 1;
      *pcVar6 = '\0';
      iVar2 = strcmp(pcVar8,"type");
      if (iVar2 == 0) {
        iVar2 = strcmp(__s1,"rsa");
        if (iVar2 == 0) {
          opt.type = 1;
          __s1 = opt.filename;
        }
        else {
          iVar2 = strcmp(__s1,"ec");
          if (iVar2 != 0) goto LAB_001096e2;
          opt.type = 2;
          __s1 = opt.filename;
        }
      }
      else {
        iVar2 = strcmp(pcVar8,"format");
        if (iVar2 == 0) {
          iVar2 = strcmp(__s1,"pem");
          if (iVar2 == 0) {
            opt._24_8_ = opt._24_8_ & 0xffffffff00000000;
            __s1 = opt.filename;
          }
          else {
            iVar2 = strcmp(__s1,"der");
            if (iVar2 != 0) goto LAB_001096e2;
            opt.format = 1;
            __s1 = opt.filename;
          }
        }
        else {
          iVar2 = strcmp(pcVar8,"rsa_keysize");
          if (iVar2 == 0) {
            iVar2 = atoi(__s1);
            opt.rsa_keysize = iVar2;
            __s1 = opt.filename;
            if (iVar2 - 0x2001U < 0xffffe3ff) goto LAB_001096e2;
          }
          else {
            iVar2 = strcmp(pcVar8,"ec_curve");
            if (iVar2 == 0) {
              pmVar5 = mbedtls_ecp_curve_info_from_name(__s1);
              if (pmVar5 == (mbedtls_ecp_curve_info *)0x0) goto LAB_001096e2;
              opt.ec_curve = pmVar5->grp_id;
              __s1 = opt.filename;
            }
            else {
              iVar2 = strcmp(pcVar8,"filename");
              if (iVar2 != 0) {
                iVar2 = strcmp(pcVar8,"use_dev_random");
                if (iVar2 != 0) goto LAB_001096e2;
                uVar3 = atoi(__s1);
                opt.use_dev_random = uVar3;
                __s1 = opt.filename;
                if (1 < uVar3) goto LAB_001096e2;
              }
            }
          }
        }
      }
      opt.filename = __s1;
      uVar9 = uVar9 + 1;
    } while ((uint)argc != uVar9);
  }
  printf("\n  . Seeding the random number generator...");
  fflush(_stdout);
  mbedtls_entropy_init(&local_840);
  if (opt.use_dev_random != 0) {
    iVar2 = 1;
    ret = mbedtls_entropy_add_source(&local_840,dev_random_entropy_poll,(void *)0x0,0x20,1);
    if (ret != 0) {
      bVar1 = false;
      printf(" failed\n  ! mbedtls_entropy_add_source returned -0x%04x\n",(ulong)(uint)-ret);
      goto LAB_001097f7;
    }
    printf("\n    Using /dev/random, so can take a long time! ");
    fflush(_stdout);
  }
  ret = mbedtls_ctr_drbg_seed(&local_998,mbedtls_entropy_func,&local_840,(uchar *)"gen_key",7);
  if (ret == 0) {
    printf("\n  . Generating the private key ...");
    fflush(_stdout);
    info = mbedtls_pk_info_from_type(opt.type);
    ret = mbedtls_pk_setup(&mStack_a68,info);
    if (ret == 0) {
      if (opt.type == 2) {
        ret = mbedtls_ecp_gen_key(opt.ec_curve,(mbedtls_ecp_keypair *)mStack_a68.pk_ctx,
                                  mbedtls_ctr_drbg_random,&local_998);
        if (ret != 0) {
          uVar9 = (ulong)(uint)-ret;
          pcVar8 = " failed\n  !  mbedtls_ecp_gen_key returned -0x%04x";
          goto LAB_001097e8;
        }
LAB_0010994e:
        puts(" ok\n  . Key information:");
        mVar4 = mbedtls_pk_get_type(&mStack_a68);
        if (mVar4 == MBEDTLS_PK_RSA) {
          ret = mbedtls_rsa_export((mbedtls_rsa_context *)mStack_a68.pk_ctx,&local_9b0,&local_9c8,
                                   &local_9e0,&local_9f8,&local_a10);
          if ((ret == 0) &&
             (ret = mbedtls_rsa_export_crt
                              ((mbedtls_rsa_context *)mStack_a68.pk_ctx,&local_a28,&local_a40,
                               &local_a58), ret == 0)) {
            ret = 0;
            mbedtls_mpi_write_file("N:  ",&local_9b0,0x10,(FILE *)0x0);
            mbedtls_mpi_write_file("E:  ",&local_a10,0x10,(FILE *)0x0);
            mbedtls_mpi_write_file("D:  ",&local_9f8,0x10,(FILE *)0x0);
            mbedtls_mpi_write_file("P:  ",&local_9c8,0x10,(FILE *)0x0);
            mbedtls_mpi_write_file("Q:  ",&local_9e0,0x10,(FILE *)0x0);
            mbedtls_mpi_write_file("DP: ",&local_a28,0x10,(FILE *)0x0);
            mbedtls_mpi_write_file("DQ:  ",&local_a40,0x10,(FILE *)0x0);
            mbedtls_mpi_write_file("QP:  ",&local_a58,0x10,(FILE *)0x0);
            iVar2 = 0;
          }
          else {
            puts(" failed\n  ! could not export RSA parameters\n");
            iVar2 = 5;
          }
          if (iVar2 == 0) goto LAB_00109a6e;
          if (iVar2 != 5) {
            return 0;
          }
        }
        else {
          mVar4 = mbedtls_pk_get_type(&mStack_a68);
          if (mVar4 == MBEDTLS_PK_ECKEY) {
            pmVar5 = mbedtls_ecp_curve_info_from_grp_id
                               (((mbedtls_ecp_group *)mStack_a68.pk_ctx)->id);
            printf("curve: %s\n",pmVar5->name);
            mbedtls_mpi_write_file
                      ("X_Q:   ",(mbedtls_mpi *)((long)mStack_a68.pk_ctx + 0x110),0x10,(FILE *)0x0);
            mbedtls_mpi_write_file
                      ("Y_Q:   ",&((mbedtls_ecp_point *)((long)mStack_a68.pk_ctx + 0x110))->Y,0x10,
                       (FILE *)0x0);
            mbedtls_mpi_write_file
                      ("D:     ",(mbedtls_mpi *)((long)mStack_a68.pk_ctx + 0xf8),0x10,(FILE *)0x0);
          }
          else {
            puts("  ! key type not supported");
          }
LAB_00109a6e:
          iVar2 = 0;
          printf("  . Writing key to file...");
          ret = write_private_key(&mStack_a68,opt.filename);
          if (ret == 0) {
            puts(" ok");
            bVar1 = true;
            goto LAB_00109947;
          }
          puts(" failed");
        }
        iVar2 = 1;
        bVar1 = false;
      }
      else {
        if (opt.type == 1) {
          ret = mbedtls_rsa_gen_key((mbedtls_rsa_context *)mStack_a68.pk_ctx,mbedtls_ctr_drbg_random
                                    ,&local_998,opt.rsa_keysize,0x10001);
          if (ret == 0) goto LAB_0010994e;
          uVar9 = (ulong)(uint)-ret;
          pcVar8 = " failed\n  !  mbedtls_rsa_gen_key returned -0x%04x";
          goto LAB_001097e8;
        }
        puts(" failed\n  !  key type not supported");
        bVar1 = false;
        iVar2 = 1;
LAB_00109947:
        ret = 0;
      }
      goto LAB_001097f7;
    }
    uVar9 = (ulong)(uint)-ret;
    pcVar8 = " failed\n  !  mbedtls_pk_setup returned -0x%04x";
  }
  else {
    uVar9 = (ulong)(uint)-ret;
    pcVar8 = " failed\n  ! mbedtls_ctr_drbg_seed returned -0x%04x\n";
  }
LAB_001097e8:
  bVar1 = false;
  printf(pcVar8,uVar9);
  iVar2 = 1;
LAB_001097f7:
  if (!bVar1) {
    mbedtls_strerror(ret,local_438,0x400);
    printf(" - %s\n",local_438);
  }
  mbedtls_mpi_free(&local_9b0);
  mbedtls_mpi_free(&local_9c8);
  mbedtls_mpi_free(&local_9e0);
  mbedtls_mpi_free(&local_9f8);
  mbedtls_mpi_free(&local_a10);
  mbedtls_mpi_free(&local_a28);
  mbedtls_mpi_free(&local_a40);
  mbedtls_mpi_free(&local_a58);
  mbedtls_pk_free(&mStack_a68);
  mbedtls_ctr_drbg_free(&local_998);
  mbedtls_entropy_free(&local_840);
  return iVar2;
}

Assistant:

int main( int argc, char *argv[] )
{
    int ret = 1;
    int exit_code = MBEDTLS_EXIT_FAILURE;
    mbedtls_pk_context key;
    char buf[1024];
    int i;
    char *p, *q;
    mbedtls_mpi N, P, Q, D, E, DP, DQ, QP;
    mbedtls_entropy_context entropy;
    mbedtls_ctr_drbg_context ctr_drbg;
    const char *pers = "gen_key";
#if defined(MBEDTLS_ECP_C)
    const mbedtls_ecp_curve_info *curve_info;
#endif

    /*
     * Set to sane values
     */

    mbedtls_mpi_init( &N ); mbedtls_mpi_init( &P ); mbedtls_mpi_init( &Q );
    mbedtls_mpi_init( &D ); mbedtls_mpi_init( &E ); mbedtls_mpi_init( &DP );
    mbedtls_mpi_init( &DQ ); mbedtls_mpi_init( &QP );

    mbedtls_pk_init( &key );
    mbedtls_ctr_drbg_init( &ctr_drbg );
    memset( buf, 0, sizeof( buf ) );

    if( argc == 0 )
    {
    usage:
        mbedtls_printf( USAGE );
#if defined(MBEDTLS_ECP_C)
        mbedtls_printf( " available ec_curve values:\n" );
        curve_info = mbedtls_ecp_curve_list();
        mbedtls_printf( "    %s (default)\n", curve_info->name );
        while( ( ++curve_info )->name != NULL )
            mbedtls_printf( "    %s\n", curve_info->name );
#endif /* MBEDTLS_ECP_C */
        goto exit;
    }

    opt.type                = DFL_TYPE;
    opt.rsa_keysize         = DFL_RSA_KEYSIZE;
    opt.ec_curve            = DFL_EC_CURVE;
    opt.filename            = DFL_FILENAME;
    opt.format              = DFL_FORMAT;
    opt.use_dev_random      = DFL_USE_DEV_RANDOM;

    for( i = 1; i < argc; i++ )
    {
        p = argv[i];
        if( ( q = strchr( p, '=' ) ) == NULL )
            goto usage;
        *q++ = '\0';

        if( strcmp( p, "type" ) == 0 )
        {
            if( strcmp( q, "rsa" ) == 0 )
                opt.type = MBEDTLS_PK_RSA;
            else if( strcmp( q, "ec" ) == 0 )
                opt.type = MBEDTLS_PK_ECKEY;
            else
                goto usage;
        }
        else if( strcmp( p, "format" ) == 0 )
        {
            if( strcmp( q, "pem" ) == 0 )
                opt.format = FORMAT_PEM;
            else if( strcmp( q, "der" ) == 0 )
                opt.format = FORMAT_DER;
            else
                goto usage;
        }
        else if( strcmp( p, "rsa_keysize" ) == 0 )
        {
            opt.rsa_keysize = atoi( q );
            if( opt.rsa_keysize < 1024 ||
                opt.rsa_keysize > MBEDTLS_MPI_MAX_BITS )
                goto usage;
        }
#if defined(MBEDTLS_ECP_C)
        else if( strcmp( p, "ec_curve" ) == 0 )
        {
            if( ( curve_info = mbedtls_ecp_curve_info_from_name( q ) ) == NULL )
                goto usage;
            opt.ec_curve = curve_info->grp_id;
        }
#endif
        else if( strcmp( p, "filename" ) == 0 )
            opt.filename = q;
        else if( strcmp( p, "use_dev_random" ) == 0 )
        {
            opt.use_dev_random = atoi( q );
            if( opt.use_dev_random < 0 || opt.use_dev_random > 1 )
                goto usage;
        }
        else
            goto usage;
    }

    mbedtls_printf( "\n  . Seeding the random number generator..." );
    fflush( stdout );

    mbedtls_entropy_init( &entropy );
#if !defined(_WIN32) && defined(MBEDTLS_FS_IO)
    if( opt.use_dev_random )
    {
        if( ( ret = mbedtls_entropy_add_source( &entropy, dev_random_entropy_poll,
                                        NULL, DEV_RANDOM_THRESHOLD,
                                        MBEDTLS_ENTROPY_SOURCE_STRONG ) ) != 0 )
        {
            mbedtls_printf( " failed\n  ! mbedtls_entropy_add_source returned -0x%04x\n", -ret );
            goto exit;
        }

        mbedtls_printf("\n    Using /dev/random, so can take a long time! " );
        fflush( stdout );
    }
#endif /* !_WIN32 && MBEDTLS_FS_IO */

    if( ( ret = mbedtls_ctr_drbg_seed( &ctr_drbg, mbedtls_entropy_func, &entropy,
                               (const unsigned char *) pers,
                               strlen( pers ) ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_ctr_drbg_seed returned -0x%04x\n", -ret );
        goto exit;
    }

    /*
     * 1.1. Generate the key
     */
    mbedtls_printf( "\n  . Generating the private key ..." );
    fflush( stdout );

    if( ( ret = mbedtls_pk_setup( &key,
            mbedtls_pk_info_from_type( (mbedtls_pk_type_t) opt.type ) ) ) != 0 )
    {
        mbedtls_printf( " failed\n  !  mbedtls_pk_setup returned -0x%04x", -ret );
        goto exit;
    }

#if defined(MBEDTLS_RSA_C) && defined(MBEDTLS_GENPRIME)
    if( opt.type == MBEDTLS_PK_RSA )
    {
        ret = mbedtls_rsa_gen_key( mbedtls_pk_rsa( key ), mbedtls_ctr_drbg_random, &ctr_drbg,
                                   opt.rsa_keysize, 65537 );
        if( ret != 0 )
        {
            mbedtls_printf( " failed\n  !  mbedtls_rsa_gen_key returned -0x%04x", -ret );
            goto exit;
        }
    }
    else
#endif /* MBEDTLS_RSA_C */
#if defined(MBEDTLS_ECP_C)
    if( opt.type == MBEDTLS_PK_ECKEY )
    {
        ret = mbedtls_ecp_gen_key( (mbedtls_ecp_group_id) opt.ec_curve,
                                   mbedtls_pk_ec( key ),
                                   mbedtls_ctr_drbg_random, &ctr_drbg );
        if( ret != 0 )
        {
            mbedtls_printf( " failed\n  !  mbedtls_ecp_gen_key returned -0x%04x", -ret );
            goto exit;
        }
    }
    else
#endif /* MBEDTLS_ECP_C */
    {
        mbedtls_printf( " failed\n  !  key type not supported\n" );
        goto exit;
    }

    /*
     * 1.2 Print the key
     */
    mbedtls_printf( " ok\n  . Key information:\n" );

#if defined(MBEDTLS_RSA_C)
    if( mbedtls_pk_get_type( &key ) == MBEDTLS_PK_RSA )
    {
        mbedtls_rsa_context *rsa = mbedtls_pk_rsa( key );

        if( ( ret = mbedtls_rsa_export    ( rsa, &N, &P, &Q, &D, &E ) ) != 0 ||
            ( ret = mbedtls_rsa_export_crt( rsa, &DP, &DQ, &QP ) )      != 0 )
        {
            mbedtls_printf( " failed\n  ! could not export RSA parameters\n\n" );
            goto exit;
        }

        mbedtls_mpi_write_file( "N:  ",  &N,  16, NULL );
        mbedtls_mpi_write_file( "E:  ",  &E,  16, NULL );
        mbedtls_mpi_write_file( "D:  ",  &D,  16, NULL );
        mbedtls_mpi_write_file( "P:  ",  &P,  16, NULL );
        mbedtls_mpi_write_file( "Q:  ",  &Q,  16, NULL );
        mbedtls_mpi_write_file( "DP: ",  &DP, 16, NULL );
        mbedtls_mpi_write_file( "DQ:  ", &DQ, 16, NULL );
        mbedtls_mpi_write_file( "QP:  ", &QP, 16, NULL );
    }
    else
#endif
#if defined(MBEDTLS_ECP_C)
    if( mbedtls_pk_get_type( &key ) == MBEDTLS_PK_ECKEY )
    {
        mbedtls_ecp_keypair *ecp = mbedtls_pk_ec( key );
        mbedtls_printf( "curve: %s\n",
                mbedtls_ecp_curve_info_from_grp_id( ecp->grp.id )->name );
        mbedtls_mpi_write_file( "X_Q:   ", &ecp->Q.X, 16, NULL );
        mbedtls_mpi_write_file( "Y_Q:   ", &ecp->Q.Y, 16, NULL );
        mbedtls_mpi_write_file( "D:     ", &ecp->d  , 16, NULL );
    }
    else
#endif
        mbedtls_printf("  ! key type not supported\n");

    /*
     * 1.3 Export key
     */
    mbedtls_printf( "  . Writing key to file..." );

    if( ( ret = write_private_key( &key, opt.filename ) ) != 0 )
    {
        mbedtls_printf( " failed\n" );
        goto exit;
    }

    mbedtls_printf( " ok\n" );

    exit_code = MBEDTLS_EXIT_SUCCESS;

exit:

    if( exit_code != MBEDTLS_EXIT_SUCCESS )
    {
#ifdef MBEDTLS_ERROR_C
        mbedtls_strerror( ret, buf, sizeof( buf ) );
        mbedtls_printf( " - %s\n", buf );
#else
        mbedtls_printf("\n");
#endif
    }

    mbedtls_mpi_free( &N ); mbedtls_mpi_free( &P ); mbedtls_mpi_free( &Q );
    mbedtls_mpi_free( &D ); mbedtls_mpi_free( &E ); mbedtls_mpi_free( &DP );
    mbedtls_mpi_free( &DQ ); mbedtls_mpi_free( &QP );

    mbedtls_pk_free( &key );
    mbedtls_ctr_drbg_free( &ctr_drbg );
    mbedtls_entropy_free( &entropy );

#if defined(_WIN32)
    mbedtls_printf( "  + Press Enter to exit this program.\n" );
    fflush( stdout ); getchar();
#endif

    return( exit_code );
}